

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O2

void __thiscall Colony::update_phero_matrix(Colony *this,double *total_tour_distance)

{
  Car *pCVar1;
  double **ppdVar2;
  pointer pNVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double tour_distance;
  double local_50;
  _Vector_base<Node,_std::allocator<Node>_> local_48;
  
  for (lVar7 = 0; lVar7 < (this->super_Graph).num_car; lVar7 = lVar7 + 1) {
    local_50 = 0.0;
    std::vector<Node,_std::allocator<Node>_>::vector
              ((vector<Node,_std::allocator<Node>_> *)&local_48,
               &(this->super_Graph).cars[lVar7].tour);
    Graph::calc_tour_distance
              (&this->super_Graph,(vector<Node,_std::allocator<Node>_> *)&local_48,&local_50);
    std::_Vector_base<Node,_std::allocator<Node>_>::~_Vector_base(&local_48);
    *total_tour_distance = local_50 + *total_tour_distance;
    pCVar1 = (this->super_Graph).cars;
    ppdVar2 = this->phero_matrix;
    pNVar3 = pCVar1[lVar7].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)pCVar1[lVar7].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pNVar3 >> 5;
    piVar4 = &pNVar3[1].idx;
    for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
      if (uVar5 - 1 != uVar6) {
        ppdVar2[piVar4[-8]][*piVar4] = ppdVar2[piVar4[-8]][*piVar4] * 0.9 + 1.0 / local_50;
      }
      piVar4 = piVar4 + 8;
    }
  }
  return;
}

Assistant:

void Colony::update_phero_matrix(double &total_tour_distance)
{
	for (int i = 0; i < num_car; i++){
		double tour_distance = 0.0;
		calc_tour_distance(cars[i].tour, tour_distance);
		total_tour_distance += tour_distance;
		for (int j = 0; j < cars[i].tour.size(); j++){
			if(j+1 != cars[i].tour.size()){
				phero_matrix[cars[i].tour[j].idx][cars[i].tour[j+1].idx] = evap_rate * phero_matrix[cars[i].tour[j].idx][cars[i].tour[j+1].idx] + q / tour_distance;
			} 
		}
	}
}